

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::modifyTailCodes(string *unit_string)

{
  bool bVar1;
  byte bVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t sz;
  value_type *endTemp;
  const_iterator __end2;
  const_iterator __begin2;
  array<std::pair<const_char_*,_const_char_*>,_12UL> *__range2;
  undefined7 in_stack_ffffffffffffff28;
  char in_stack_ffffffffffffff2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined7 in_stack_ffffffffffffff48;
  __const_iterator __i2;
  __const_iterator __i1;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator<char> local_51 [33];
  const_iterator local_30;
  const_iterator local_28;
  const_iterator local_20;
  array<std::pair<const_char_*,_const_char_*>,_12UL> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RDI;
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6c1a0c);
  if ((!bVar1) &&
     ((pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::back(in_stack_ffffffffffffff30), *pvVar3 == 'F' ||
      (pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::back(in_stack_ffffffffffffff30), *pvVar3 == 'C')))) {
    local_18 = &modifyTailCodes::trailTempCodeReplacements;
    local_20 = std::array<std::pair<const_char_*,_const_char_*>,_12UL>::begin
                         ((array<std::pair<const_char_*,_const_char_*>,_12UL> *)0x6c1a5d);
    local_28 = std::array<std::pair<const_char_*,_const_char_*>,_12UL>::end
                         ((array<std::pair<const_char_*,_const_char_*>,_12UL> *)0x6c1a71);
    for (; local_20 != local_28; local_20 = local_20 + 1) {
      local_30 = local_20;
      __i2._M_current = local_20->first;
      __i1._M_current = (char *)local_51;
      pbVar4 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 (allocator<char> *)__i1._M_current);
      bVar2 = ends_with(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff30);
      std::allocator<char>::~allocator((allocator<char> *)local_51);
      if ((bVar2 & 1) != 0) {
        strlen(local_30->first);
        this = local_10;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10);
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this,(difference_type)in_stack_ffffffffffffff30);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff30,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff30,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                  (pbVar4,__i1,__i2,(char *)CONCAT17(bVar2,in_stack_ffffffffffffff48));
        pbVar4 = local_10;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10);
        pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_ffffffffffffff30,
                            CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
        if (*pvVar3 != '_') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar4,
                 (size_type)this,(size_type)local_10,in_stack_ffffffffffffff2f);
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool modifyTailCodes(std::string& unit_string)
{
    if (!unit_string.empty() &&
        (unit_string.back() == 'F' || unit_string.back() == 'C')) {
        static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 12>
            trailTempCodeReplacements{{
                ckpair{"at39F", "[39]"},
                ckpair{"39F", "[39]"},
                ckpair{"at60F", "[60]"},
                ckpair{"60F", "[60]"},
                ckpair{"at20C", "[20]"},
                ckpair{"20C", "[20]"},
                ckpair{"at23C", "[23]"},
                ckpair{"23C", "[23]"},
                ckpair{"at4C", "[04]"},
                ckpair{"4C", "[04]"},
                ckpair{"at0C", "[00]"},
                ckpair{"0C", "[00]"},

            }};

        for (const auto& endTemp : trailTempCodeReplacements) {
            if (ends_with(unit_string, endTemp.first)) {
                auto sz = strlen(endTemp.first);
                unit_string.replace(
                    unit_string.end() - sz, unit_string.end(), endTemp.second);
                if (unit_string[unit_string.size() - 5] != '_') {
                    unit_string.insert(unit_string.size() - 4, 1, '_');
                }
                return true;
            }
        }
    }
    return false;
}